

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O0

string * BamTools::Internal::BamIndexFactory::FindIndexFilename
                   (string *bamFilename,IndexType *preferredType)

{
  ulong uVar1;
  int *in_RDX;
  string *in_RDI;
  string indexFilename;
  string local_98 [52];
  undefined4 local_64;
  string local_60 [36];
  undefined4 local_3c;
  string local_38 [8];
  IndexType *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::string((string *)in_RDI);
    return in_RDI;
  }
  CreateIndexFilename(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,local_38);
  }
  else {
    if (*in_RDX != 1) {
      local_64 = 1;
      CreateIndexFilename(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::__cxx11::string::operator=(local_38,local_60);
      std::__cxx11::string::~string(local_60);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::string((string *)in_RDI,local_38);
        goto LAB_002ccb18;
      }
    }
    if (*in_RDX != 0) {
      CreateIndexFilename(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::__cxx11::string::operator=(local_38,local_98);
      std::__cxx11::string::~string(local_98);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::string((string *)in_RDI,local_38);
        goto LAB_002ccb18;
      }
    }
    std::__cxx11::string::string((string *)in_RDI);
  }
LAB_002ccb18:
  local_3c = 1;
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

const std::string BamIndexFactory::FindIndexFilename(const std::string& bamFilename,
                                                     const BamIndex::IndexType& preferredType)
{
    // skip if BAM filename provided is empty
    if (bamFilename.empty()) return std::string();

    // try to find index of preferred type first
    // return index filename if found
    std::string indexFilename = CreateIndexFilename(bamFilename, preferredType);
    if (!indexFilename.empty()) return indexFilename;

    // couldn't find preferred type, try the other supported types
    // return index filename if found
    if (preferredType != BamIndex::STANDARD) {
        indexFilename = CreateIndexFilename(bamFilename, BamIndex::STANDARD);
        if (!indexFilename.empty()) return indexFilename;
    }
    if (preferredType != BamIndex::BAMTOOLS) {
        indexFilename = CreateIndexFilename(bamFilename, BamIndex::BAMTOOLS);
        if (!indexFilename.empty()) return indexFilename;
    }

    // otherwise couldn't find any index matching this filename
    return std::string();
}